

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O2

GCstr * lj_ctype_repr(lua_State *L,CTypeID id,GCstr *name)

{
  uint uVar1;
  MSize MVar2;
  bool bVar3;
  GCstr *pGVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint qual;
  CType *ct;
  char *pcVar9;
  uint32_t n;
  size_t sStack_280;
  char local_259;
  CTRepr ctr;
  
  ctr.pb = ctr.buf + 0x100;
  ctr.cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  ctr.needsp = 0;
  ctr.ok = 1;
  ct = (ctr.cts)->tab + id;
  bVar3 = false;
  qual = 0;
  ctr.pe = ctr.pb;
  ctr.L = L;
  do {
    uVar1 = ct->info;
    if (8 < uVar1 >> 0x1c) goto switchD_0011ba51_caseD_7;
    n = ct->size;
    switch(uVar1 >> 0x1c) {
    case 0:
      goto switchD_0011ba51_caseD_0;
    case 1:
      pcVar9 = "union";
      if ((uVar1 >> 0x17 & 1) == 0) {
        pcVar9 = "struct";
      }
      goto LAB_0011be23;
    case 2:
      if ((uVar1 >> 0x17 & 1) == 0) {
        ctype_prepqual(&ctr,qual | uVar1);
        if (n == 4) {
          ctype_prepstr(&ctr,"__ptr32",7);
        }
        if (ctr.buf < ctr.pb) {
          ctr.pb[-1] = '*';
          ctr.pb = ctr.pb + -1;
        }
        else {
          ctr.needsp = 0;
          ctr.ok = 0;
        }
      }
      else if (ctr.buf < ctr.pb) {
        ctr.pb[-1] = '&';
        ctr.pb = ctr.pb + -1;
      }
      else {
        ctr.needsp = 0;
        ctr.ok = 0;
      }
      ctr.needsp = 1;
      qual = 0;
      bVar3 = true;
      break;
    case 3:
      if ((uVar1 & 0xfc000000) == 0x30000000) {
        ctr.needsp = 1;
        if (bVar3) {
          if (ctr.buf < ctr.pb) {
            ctr.pb[-1] = '(';
            ctr.pb = ctr.pb + -1;
          }
          else {
            ctr.needsp = 1;
            ctr.ok = 0;
          }
          if (ctr.pe < &stack0xffffffffffffffd0) {
            *ctr.pe = ')';
            ctr.pe = ctr.pe + 1;
          }
          else {
            ctr._32_8_ = ctr._32_8_ & 0xffffffff;
          }
        }
        if (ctr.pe < &stack0xffffffffffffffd0) {
          *ctr.pe = '[';
          ctr.pe = ctr.pe + 1;
        }
        else {
          ctr._32_8_ = ctr._32_8_ & 0xffffffff;
        }
        pcVar9 = ctr.pe;
        if (n == 0xffffffff) {
          if ((uVar1 >> 0x14 & 1) != 0) {
            if (&stack0xffffffffffffffd0 <= ctr.pe) goto LAB_0011bceb;
            *ctr.pe = '?';
            ctr.pe = ctr.pe + 1;
          }
        }
        else {
          uVar5 = (ctr.cts)->tab[(ushort)ct->info].size;
          if (uVar5 == 0) {
            uVar6 = 0;
          }
          else {
            uVar6 = (ulong)n / (ulong)uVar5;
          }
          if (ctr.buf + 0x1f6 < ctr.pe) {
LAB_0011bceb:
            ctr._32_8_ = ctr._32_8_ & 0xffffffff;
          }
          else {
            lVar8 = 0;
            do {
              lVar7 = lVar8;
              uVar5 = (uint)uVar6;
              ctr.buf[lVar7 + -0x29] = (byte)(uVar6 % 10) | 0x30;
              lVar8 = lVar7 + -1;
              uVar6 = uVar6 / 10;
            } while (9 < uVar5);
            memcpy(ctr.pe,ctr.buf + lVar7 + -0x29,-lVar8);
            ctr.pe = pcVar9 + -lVar8;
          }
        }
        if (&stack0xffffffffffffffd0 <= ctr.pe) goto LAB_0011bd4a;
        *ctr.pe = ']';
        ctr.pe = ctr.pe + 1;
        goto LAB_0011bd4f;
      }
      if ((uVar1 >> 0x1a & 1) != 0) {
        if (n == 8) {
          ctype_prepstr(&ctr,"float",5);
        }
        pcVar9 = "complex";
        MVar2 = 7;
        goto LAB_0011be59;
      }
      ctype_prepstr(&ctr,")))",3);
      ctype_prepnum(&ctr,n);
      ctype_prepstr(&ctr,"__attribute__((vector_size(",0x1b);
      break;
    case 4:
      ctype_prepstr(&ctr,"void",4);
      ctype_prepqual(&ctr,uVar1 | qual);
      goto LAB_0011bf8a;
    case 5:
      if (id == 0x15) {
        pcVar9 = "ctype";
        MVar2 = 5;
LAB_0011be59:
        ctype_prepstr(&ctr,pcVar9,MVar2);
      }
      else {
        pcVar9 = "enum";
LAB_0011be23:
        ctype_preptype(&ctr,ct,qual,pcVar9);
      }
      goto LAB_0011bf8a;
    case 6:
      ctr.needsp = 1;
      if (bVar3) {
        if (ctr.buf < ctr.pb) {
          ctr.pb[-1] = '(';
          ctr.pb = ctr.pb + -1;
        }
        else {
          ctr.needsp = 1;
          ctr.ok = 0;
        }
        if (ctr.pe < &stack0xffffffffffffffd0) {
          *ctr.pe = ')';
          ctr.pe = ctr.pe + 1;
        }
        else {
          ctr._32_8_ = ctr._32_8_ & 0xffffffff;
        }
      }
      if (ctr.pe < &stack0xffffffffffffffd0) {
        *ctr.pe = '(';
        ctr.pe = ctr.pe + 1;
      }
      else {
        ctr._32_8_ = ctr._32_8_ & 0xffffffff;
      }
      if (ctr.pe < &stack0xffffffffffffffd0) {
        *ctr.pe = ')';
        ctr.pe = ctr.pe + 1;
      }
      else {
LAB_0011bd4a:
        ctr._32_8_ = ctr._32_8_ & 0xffffffff;
      }
LAB_0011bd4f:
      bVar3 = false;
      break;
    case 8:
      if ((uVar1 & 0xff0000) != 0x10000) {
        n = 0;
      }
      qual = qual | n;
    }
switchD_0011ba51_caseD_7:
    ct = (CType *)((long)&(ctr.cts)->tab->info + (ulong)((uVar1 & 0xffff) << 4));
  } while( true );
switchD_0011ba51_caseD_0:
  if ((uVar1 >> 0x1b & 1) != 0) {
    ctype_prepstr(&ctr,"bool",4);
    goto LAB_0011bf7a;
  }
  if ((uVar1 >> 0x1a & 1) == 0) {
    if (n == 1) {
      if ((uVar1 >> 0x17 & 1) == 0) {
        pcVar9 = "char";
        MVar2 = 4;
      }
      else {
        pcVar9 = "unsigned char";
        MVar2 = 0xd;
      }
    }
    else {
      if (7 < n) {
        ctype_prepstr(&ctr,"_t",2);
        ctype_prepnum(&ctr,n << 3);
        ctype_prepstr(&ctr,"int",3);
        if ((uVar1 >> 0x17 & 1) != 0) {
          if (ctr.buf < ctr.pb) {
            ctr.pb[-1] = 'u';
            ctr.pb = ctr.pb + -1;
          }
          else {
            ctr._32_8_ = ctr._32_8_ & 0xffffffff;
          }
        }
        goto LAB_0011bf7a;
      }
      if (n == 4) {
        pcVar9 = "int";
        MVar2 = 3;
      }
      else {
        pcVar9 = "short";
        MVar2 = 5;
      }
      ctype_prepstr(&ctr,pcVar9,MVar2);
      if ((uVar1 >> 0x17 & 1) == 0) goto LAB_0011bf7a;
      pcVar9 = "unsigned";
      MVar2 = 8;
    }
  }
  else if (n == 4) {
    pcVar9 = "float";
    MVar2 = 5;
  }
  else if (n == 8) {
    pcVar9 = "double";
    MVar2 = 6;
  }
  else {
    pcVar9 = "long double";
    MVar2 = 0xb;
  }
  ctype_prepstr(&ctr,pcVar9,MVar2);
LAB_0011bf7a:
  ctype_prepqual(&ctr,uVar1 | qual);
LAB_0011bf8a:
  if (ctr.ok == 0) {
    pcVar9 = "?";
    sStack_280 = 1;
  }
  else {
    sStack_280 = (long)ctr.pe - (long)ctr.pb;
    pcVar9 = ctr.pb;
  }
  pGVar4 = lj_str_new(L,pcVar9,sStack_280);
  return pGVar4;
}

Assistant:

GCstr *lj_ctype_repr(lua_State *L, CTypeID id, GCstr *name)
{
  global_State *g = G(L);
  CTRepr ctr;
  ctr.pb = ctr.pe = &ctr.buf[CTREPR_MAX/2];
  ctr.cts = ctype_ctsG(g);
  ctr.L = L;
  ctr.ok = 1;
  ctr.needsp = 0;
  if (name) ctype_prepstr(&ctr, strdata(name), name->len);
  ctype_repr(&ctr, id);
  if (LJ_UNLIKELY(!ctr.ok)) return lj_str_newlit(L, "?");
  return lj_str_new(L, ctr.pb, ctr.pe - ctr.pb);
}